

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Value::isUInt64(Value *this)

{
  double d;
  char cVar1;
  bool bVar2;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x03') {
    d = (this->value_).real_;
    bVar2 = false;
    if ((0.0 <= d) && (d < 1.8446744073709552e+19)) {
      bVar2 = IsIntegral(d);
      return bVar2;
    }
  }
  else {
    if (cVar1 == '\x02') {
      return true;
    }
    if (cVar1 != '\x01') {
      return false;
    }
    bVar2 = -1 < (this->value_).int_;
  }
  return bVar2;
}

Assistant:

bool Value::isUInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case intValue:
    return value_.int_ >= 0;
  case uintValue:
    return true;
  case realValue:
    // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
    // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= 0 && value_.real_ < maxUInt64AsDouble &&
           IsIntegral(value_.real_);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}